

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

TreeEnsembleClassifier * __thiscall
CoreML::Specification::Model::mutable_treeensembleclassifier(Model *this)

{
  bool bVar1;
  TreeEnsembleClassifier *this_00;
  Model *this_local;
  
  bVar1 = has_treeensembleclassifier(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_treeensembleclassifier(this);
    this_00 = (TreeEnsembleClassifier *)operator_new(0x30);
    TreeEnsembleClassifier::TreeEnsembleClassifier(this_00);
    (this->Type_).treeensembleclassifier_ = this_00;
  }
  return (TreeEnsembleClassifier *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::TreeEnsembleClassifier* Model::mutable_treeensembleclassifier() {
  if (!has_treeensembleclassifier()) {
    clear_Type();
    set_has_treeensembleclassifier();
    Type_.treeensembleclassifier_ = new ::CoreML::Specification::TreeEnsembleClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.treeEnsembleClassifier)
  return Type_.treeensembleclassifier_;
}